

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryTransfer
          (InMemoryDirectory *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode)

{
  Type type;
  EntryImpl *entry_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  NullableValue<kj::FsNode::Metadata> *other;
  Metadata *pMVar4;
  Impl *pIVar5;
  String *pSVar6;
  Own<const_kj::Directory> *pOVar7;
  Directory *pDVar8;
  Type *func;
  PathPtr PVar9;
  StringPtr name;
  undefined4 local_1d8;
  undefined4 uStack_1d0;
  StringPtr local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  OwnOwn<const_kj::Directory> child;
  Fault f_1;
  Maybe<unsigned_long> local_168;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_158;
  undefined1 *local_148;
  Date local_140;
  InMemoryDirectory **local_138;
  undefined1 local_130 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1278:11)>
  _kjDefer1278;
  undefined1 auStack_108 [7];
  bool needRollback;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> local_f8;
  EntryImpl *local_f0;
  EntryImpl *entry;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Maybe<kj::FsNode::Metadata> local_c8;
  undefined1 local_90 [8];
  NullableValue<kj::FsNode::Metadata> meta;
  Fault local_48;
  Fault f;
  TransferMode mode_local;
  Directory *fromDirectory_local;
  WriteMode toMode_local;
  InMemoryDirectory *this_local;
  PathPtr toPath_local;
  
  toPath_local.parts.ptr = (String *)toPath.parts.size_;
  this_local = (InMemoryDirectory *)toPath.parts.ptr;
  f.exception._4_4_ = mode;
  sVar3 = PathPtr::size((PathPtr *)&this_local);
  if (sVar3 == 0) {
    bVar1 = has<kj::WriteMode,void>(toMode,CREATE);
    if (bVar1) {
      toPath_local.parts.size_._7_1_ = 0;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4f4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      toPath_local.parts.size_._7_1_ = 0;
      _::Debug::Fault::~Fault(&local_48);
    }
  }
  else {
    sVar3 = PathPtr::size((PathPtr *)&this_local);
    if (sVar3 == 1) {
      lock.ptr._0_4_ = fromPath.parts.ptr._0_4_;
      lock.ptr._4_4_ = fromPath.parts.ptr._4_4_;
      (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[9])
                (&local_c8,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      other = _::readMaybe<kj::FsNode::Metadata>(&local_c8);
      _::NullableValue<kj::FsNode::Metadata>::NullableValue
                ((NullableValue<kj::FsNode::Metadata> *)local_90,other);
      Maybe<kj::FsNode::Metadata>::~Maybe(&local_c8);
      pMVar4 = _::NullableValue::operator_cast_to_Metadata_((NullableValue *)local_90);
      if (pMVar4 == (Metadata *)0x0) {
        toPath_local.parts.size_._7_1_ = 0;
      }
      else {
        MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
                  ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
        pIVar5 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                           ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
        pSVar6 = PathPtr::operator[]((PathPtr *)&this_local,0);
        StringPtr::StringPtr((StringPtr *)auStack_108,pSVar6);
        local_f8 = Impl::openEntry(pIVar5,(StringPtr)_auStack_108,toMode);
        local_f0 = _::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>(&local_f8);
        if (local_f0 == (EntryImpl *)0x0) {
          toPath_local.parts.size_._7_1_ = 0;
        }
        else {
          _kjDefer1278._31_1_ =
               OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
               ::operator==(&local_f0->node,(void *)0x0);
          local_148 = &_kjDefer1278.field_0x1f;
          local_140.value.value = (Quantity<long,_kj::_::NanosecondLabel>)&entry;
          local_138 = &this_local;
          defer<kj::(anonymous_namespace)::InMemoryDirectory::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode)const::_lambda()_1_>
                    ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1278:11)>
                      *)local_130,(kj *)&local_148,func);
          pIVar5 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                             ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
          entry_00 = local_f0;
          pMVar4 = _::NullableValue<kj::FsNode::Metadata>::operator->
                             ((NullableValue<kj::FsNode::Metadata> *)local_90);
          type = pMVar4->type;
          pMVar4 = _::NullableValue<kj::FsNode::Metadata>::operator->
                             ((NullableValue<kj::FsNode::Metadata> *)local_90);
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>::Maybe
                    (&local_158,&pMVar4->lastModified);
          pMVar4 = _::NullableValue<kj::FsNode::Metadata>::operator->
                             ((NullableValue<kj::FsNode::Metadata> *)local_90);
          Maybe<unsigned_long>::Maybe(&local_168,&pMVar4->size);
          bVar1 = Impl::tryTransferChild
                            (pIVar5,entry_00,type,&local_158,&local_168,fromDirectory,fromPath,
                             f.exception._4_4_);
          Maybe<unsigned_long>::~Maybe(&local_168);
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>::~Maybe
                    (&local_158);
          if (bVar1) {
            pIVar5 = Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                               ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry
                               );
            Impl::modified(pIVar5);
            _kjDefer1278._31_1_ = 0;
            toPath_local.parts.size_._7_1_ = 1;
          }
          else {
            _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51],kj::PathPtr&>
                      ((Fault *)&child.value.ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x506,FAILED,(char *)0x0,
                       "\"InMemoryDirectory can\'t link an inode of this type\", fromPath",
                       (char (*) [51])"InMemoryDirectory can\'t link an inode of this type",
                       &fromPath);
            toPath_local.parts.size_._7_1_ = 0;
            _::Debug::Fault::~Fault((Fault *)&child.value.ptr);
          }
          _::
          Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++:1278:11)>
          ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_c__:1278:11)>
                       *)local_130);
        }
        Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                  ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&entry);
      }
      _::NullableValue<kj::FsNode::Metadata>::~NullableValue
                ((NullableValue<kj::FsNode::Metadata> *)local_90);
    }
    else {
      pSVar6 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr(&local_1b8,pSVar6);
      name.content.size_ = (size_t)local_1b8.content.ptr;
      name.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_1a8,name,(WriteMode)local_1b8.content.size_);
      _::readMaybe<kj::Directory_const>
                ((_ *)local_198,(Maybe<kj::Own<const_kj::Directory>_> *)local_1a8);
      Maybe<kj::Own<const_kj::Directory>_>::~Maybe
                ((Maybe<kj::Own<const_kj::Directory>_> *)local_1a8);
      pOVar7 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_198);
      if (pOVar7 == (Own<const_kj::Directory> *)0x0) {
        toPath_local.parts.size_._7_1_ = 0;
      }
      else {
        pOVar7 = _::OwnOwn<const_kj::Directory>::operator->
                           ((OwnOwn<const_kj::Directory> *)local_198);
        pDVar8 = Own<const_kj::Directory>::get(pOVar7);
        sVar3 = PathPtr::size((PathPtr *)&this_local);
        PVar9 = PathPtr::slice((PathPtr *)&this_local,1,sVar3);
        local_1d8 = fromPath.parts.ptr._0_4_;
        uStack_1d0 = (undefined4)fromPath.parts.size_;
        iVar2 = (*(pDVar8->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x14])
                          (pDVar8,PVar9.parts.ptr,PVar9.parts.size_,(ulong)toMode,fromDirectory,
                           (ulong)f.exception._4_4_,local_1d8,uStack_1d0);
        toPath_local.parts.size_._7_1_ = (byte)iVar2 & 1;
      }
      _::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_198);
    }
  }
  return (bool)(toPath_local.parts.size_._7_1_ & 1);
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode) const override {
    if (toPath.size() == 0) {
      if (has(toMode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (toPath.size() == 1) {
      // tryTransferChild() needs to at least know the node type, so do an lstat.
      KJ_IF_MAYBE(meta, fromDirectory.tryLstat(fromPath)) {
        auto lock = impl.lockExclusive();
        KJ_IF_MAYBE(entry, lock->openEntry(toPath[0], toMode)) {
          // Make sure if we just cerated a new entry, and we don't successfully transfer to it, we
          // remove the entry before returning.
          bool needRollback = entry->node == nullptr;
          KJ_DEFER(if (needRollback) { lock->entries.erase(toPath[0]); });

          if (lock->tryTransferChild(*entry, meta->type, meta->lastModified, meta->size,
                                     fromDirectory, fromPath, mode)) {
            lock->modified();
            needRollback = false;
            return true;
          } else {
            KJ_FAIL_REQUIRE("InMemoryDirectory can't link an inode of this type", fromPath) {
              return false;
            }
          }
        } else {
          return false;
        }
      } else {
        return false;
      }
    } else {
      // TODO(someday): Ideally we wouldn't create parent directories if fromPath doesn't exist.
      //   This requires a different approach to the code here, though.
      KJ_IF_MAYBE(child, tryGetParent(toPath[0], toMode)) {
        return child->get()->tryTransfer(
            toPath.slice(1, toPath.size()), toMode, fromDirectory, fromPath, mode);
      } else {
        return false;
      }
    }
  }